

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyProvokingVertexLayers
          (LayeredRenderCase *this,Surface *layer0,Surface *layer1)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_888;
  MessageBuilder local_708;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  LogImage local_538;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  LogImage local_458;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  LogImageSet local_378;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  byte local_23;
  byte local_22;
  byte local_21;
  bool error;
  bool layer1Empty;
  Surface *pSStack_20;
  bool layer0Empty;
  Surface *layer1_local;
  Surface *layer0_local;
  LayeredRenderCase *this_local;
  
  pSStack_20 = layer1;
  layer1_local = layer0;
  layer0_local = (Surface *)this;
  local_21 = verifyEmptyImage(this,layer0,false);
  local_22 = verifyEmptyImage(this,pSStack_20,false);
  local_23 = 0;
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [48])"Expecting non-empty layers, or non-empty layer.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  if (((local_21 & 1) == 1) && ((local_22 & 1) == 1)) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [18])"Got empty images.");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
    local_23 = 1;
  }
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"LayerContent",&local_399)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"Layer content",&local_3c1);
  tcu::LogImageSet::LogImageSet(&local_378,&local_398,&local_3c0);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"Layer",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Layer0",&local_4a1);
  tcu::LogImage::LogImage
            (&local_458,&local_478,&local_4a0,layer1_local,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"Layer",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"Layer1",&local_581);
  tcu::LogImage::LogImage
            (&local_538,&local_558,&local_580,pSStack_20,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_538);
  tcu::TestLog::operator<<(pTVar1,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  tcu::LogImage::~LogImage(&local_538);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  tcu::LogImage::~LogImage(&local_458);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  tcu::LogImageSet::~LogImageSet(&local_378);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  if ((local_23 & 1) == 0) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_888,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_888,(char (*) [16])"Image is valid.");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_888);
  }
  else {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_708,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_708,(char (*) [27])"Image verification failed.")
    ;
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_708);
  }
  return (bool)((local_23 ^ 0xff) & 1);
}

Assistant:

bool LayeredRenderCase::verifyProvokingVertexLayers (const tcu::Surface& layer0, const tcu::Surface& layer1)
{
	const bool		layer0Empty		= verifyEmptyImage(layer0, false);
	const bool		layer1Empty		= verifyEmptyImage(layer1, false);
	bool			error			= false;

	// Both images could contain something if the quad triangles get assigned to different layers
	m_testCtx.getLog() << tcu::TestLog::Message << "Expecting non-empty layers, or non-empty layer." << tcu::TestLog::EndMessage;

	if (layer0Empty == true && layer1Empty == true)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got empty images." << tcu::TestLog::EndMessage;
		error = true;
	}

	// log images always
	m_testCtx.getLog()
		<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
		<< tcu::TestLog::Image("Layer", "Layer0", layer0)
		<< tcu::TestLog::Image("Layer", "Layer1", layer1)
		<< tcu::TestLog::EndImageSet;

	if (error)
		m_testCtx.getLog() << tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage;

	return !error;
}